

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP2Connection.cpp
# Opt level: O1

ssize_t __thiscall HTTP2Connection::sendFrame(HTTP2Connection *this)

{
  int __fd;
  char *__buf;
  uint uVar1;
  ostream *poVar2;
  long *plVar3;
  ssize_t sVar4;
  string local_50;
  
  HTTP2Frame::getFrame((HTTP2Frame *)&stack0x00000008,this->sendBuffer);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)*this->sendBuffer);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[4]);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sending frame: ",0xf);
  HTTP2Frame::debugFrame_abi_cxx11_(&local_50,(HTTP2Frame *)&stack0x00000008,this->sendBuffer);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Size: ",7);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  HTTP2Frame::getSize((HTTP2Frame *)&stack0x00000008);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __fd = this->socket;
  __buf = this->sendBuffer;
  uVar1 = HTTP2Frame::getSize((HTTP2Frame *)&stack0x00000008);
  sVar4 = write(__fd,__buf,(ulong)uVar1);
  return sVar4;
}

Assistant:

ssize_t HTTP2Connection::sendFrame(HTTP2Frame frame) {
    frame.getFrame(sendBuffer);
    std::cout<< std::hex << (int)sendBuffer[0] << " " << (int)sendBuffer[1] << " " << (int)sendBuffer[2] << " " << (int)sendBuffer[3] << " " << (int)sendBuffer[4]<< std::endl;
    std::cout << "Sending frame: " << frame.debugFrame(sendBuffer) << " Size: " << std::dec << frame.getSize() << std::endl;
    return write(socket, sendBuffer, frame.getSize());
}